

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

void * pthNotifyThread(void *x)

{
  gpioReport_t *pgVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  callback_t *pcVar7;
  evtCallback_t *peVar8;
  callback_t **ppcVar9;
  evtCallback_t **ppeVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  ulong uStack_c040;
  gpioReport_t report [4096];
  
  uVar3 = *x;
  free(x);
  while( true ) {
    uStack_c040 = read(gPigNotify[(int)uVar3],
                       (void *)((long)&report[0].seqno + (long)pthNotifyThread::got),
                       0xc000 - (long)pthNotifyThread::got);
    if ((int)uStack_c040 < 1) break;
    uVar12 = 0;
    while( true ) {
      pthNotifyThread::got = (int)uStack_c040 + pthNotifyThread::got;
      if ((uint)pthNotifyThread::got < 0xc) break;
      uVar2 = report[uVar12].flags;
      if (uVar2 == 0) {
        uVar11 = report[uVar12].level;
        uVar4 = gLastLevel[(int)uVar3];
        uVar5 = gNotifyBits[(int)uVar3];
        gLastLevel[(int)uVar3] = uVar11;
        ppcVar9 = &gCallBackFirst;
        while (pcVar7 = *ppcVar9, pcVar7 != (callback_t *)0x0) {
          if (pcVar7->pi == uVar3) {
            uVar6 = pcVar7->gpio;
            if (((((uVar4 ^ uVar11) & uVar5) >> (uVar6 & 0x1f) & 1) != 0) &&
               (bVar13 = (uVar11 >> (uVar6 & 0x1f) & 1) != 0, pcVar7->edge != (uint)bVar13)) {
              if (pcVar7->ex == 0) {
                (*pcVar7->f)((ulong)uVar3,(ulong)uVar6,(ulong)bVar13,(ulong)report[uVar12].tick);
              }
              else {
                (*pcVar7->f)((ulong)uVar3);
              }
            }
          }
          ppcVar9 = &pcVar7->next;
        }
      }
      else if ((uVar2 & 0x20) == 0) {
        if ((char)uVar2 < '\0') {
          uVar11 = uVar2 & 0x1f;
          ppeVar10 = &geCallBackFirst;
          while (peVar8 = *ppeVar10, peVar8 != (evtCallback_t *)0x0) {
            if ((peVar8->pi == uVar3) && (peVar8->event == uVar11)) {
              if (peVar8->ex == 0) {
                (*peVar8->f)((ulong)uVar3,(ulong)uVar11,(ulong)report[uVar12].tick);
              }
              else {
                (*peVar8->f)((ulong)uVar3,(ulong)uVar11,(ulong)report[uVar12].tick,peVar8->user);
              }
            }
            ppeVar10 = &peVar8->next;
          }
        }
      }
      else {
        uVar11 = uVar2 & 0x1f;
        ppcVar9 = &gCallBackFirst;
        while (pcVar7 = *ppcVar9, pcVar7 != (callback_t *)0x0) {
          if ((pcVar7->pi == uVar3) && (pcVar7->gpio == uVar11)) {
            if (pcVar7->ex == 0) {
              (*pcVar7->f)((ulong)uVar3,(ulong)uVar11,2,(ulong)report[uVar12].tick);
            }
            else {
              (*pcVar7->f)((ulong)uVar3,(ulong)uVar11,2,(ulong)report[uVar12].tick,pcVar7->user);
            }
          }
          ppcVar9 = &pcVar7->next;
        }
      }
      uVar12 = uVar12 + 1;
      uStack_c040 = 0xfffffffffffffff4;
    }
    if (uVar12 != 0 && pthNotifyThread::got != 0) {
      report[0].level = report[uVar12 & 0xffffffff].level;
      pgVar1 = report + (uVar12 & 0xffffffff);
      report[0].seqno = pgVar1->seqno;
      report[0].flags = pgVar1->flags;
      report[0].tick = pgVar1->tick;
    }
  }
  fprintf(_stderr,"notify thread for pi %d broke with read error %d\n",(ulong)uVar3,
          uStack_c040 & 0xffffffff);
  do {
    sleep(1);
  } while( true );
}

Assistant:

static void *pthNotifyThread(void *x)
{
   static int got = 0;
   int pi;
   int bytes, r;
   gpioReport_t report[PI_MAX_REPORTS_PER_READ];

   pi = *((int*)x);
   free(x); /* memory allocated in pigpio_start */

   while (1)
   {
      bytes = read(gPigNotify[pi], (char*)&report+got, sizeof(report)-got);

      if (bytes > 0) got += bytes;
      else break;

      r = 0;

      while (got >= sizeof(gpioReport_t))
      {
         dispatch_notification(pi, &report[r]);

         r++;

         got -= sizeof(gpioReport_t);
      }

      /* copy any partial report to start of array */
      
      if (got && r) report[0] = report[r];
   }

   fprintf(stderr, "notify thread for pi %d broke with read error %d\n",
      pi, bytes);

   while (1) sleep(1);

   return NULL;
}